

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_close(cram_fd *fd)

{
  cram_container *c;
  spare_bams *psVar1;
  bam1_t *b;
  int iVar2;
  ssize_t sVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  spare_bams *__ptr;
  long lVar8;
  
  if (fd == (cram_fd *)0x0) {
    return -1;
  }
  if ((fd->mode == 0x77) && (c = fd->ctr, c != (cram_container *)0x0)) {
    if (c->slice != (cram_slice *)0x0) {
      c->curr_slice = c->curr_slice + 1;
    }
    iVar2 = cram_flush_container_mt(fd,c);
    if (iVar2 == -1) {
      return -1;
    }
  }
  if (fd->pool != (t_pool *)0x0) {
    t_pool_flush(fd->pool);
    iVar2 = cram_flush_result(fd);
    if (iVar2 != 0) {
      return -1;
    }
    pthread_mutex_destroy((pthread_mutex_t *)&fd->metrics_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&fd->ref_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&fd->bam_list_lock);
    fd->ctr = (cram_container *)0x0;
    t_results_queue_destroy(fd->rqueue);
  }
  if (fd->mode == 0x77) {
    if ((fd->version & 0xffffff00U) == 0x300) {
      sVar3 = hwrite(fd->fp,"\x0f",0x26);
      if (sVar3 != 0x26) {
        return -1;
      }
    }
    else {
      sVar3 = hwrite(fd->fp,"\v",0x1e);
      if (sVar3 != 0x1e) {
        return -1;
      }
    }
  }
  __ptr = fd->bl;
  while (__ptr != (spare_bams *)0x0) {
    uVar6 = fd->slices_per_container * fd->seqs_per_slice;
    psVar1 = __ptr->next;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = 0;
    }
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      b = __ptr->bams[uVar5];
      if (b != (bam1_t *)0x0) {
        bam_destroy1(b);
      }
    }
    free(__ptr->bams);
    free(__ptr);
    __ptr = psVar1;
  }
  iVar2 = hclose(fd->fp);
  iVar4 = -1;
  if (iVar2 == 0) {
    free(fd->file_def);
    if (fd->header != (SAM_hdr *)0x0) {
      sam_hdr_free(fd->header);
    }
    free(fd->prefix);
    if (fd->ctr != (cram_container *)0x0) {
      cram_free_container(fd->ctr);
    }
    if (fd->refs != (refs_t *)0x0) {
      refs_free(fd->refs);
    }
    free(fd->ref_free);
    for (lVar8 = 0x10; lVar8 != 0x3f; lVar8 = lVar8 + 1) {
      free(fd->m[lVar8 + -0x10]);
    }
    if (fd->index != (cram_index *)0x0) {
      cram_index_free(fd);
    }
    if ((fd->own_pool != 0) && (fd->pool != (t_pool *)0x0)) {
      t_pool_destroy(fd->pool,0);
    }
    free(fd);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cram_close(cram_fd *fd) {
    spare_bams *bl, *next;
    int i;
	
    if (!fd)
	return -1;

    if (fd->mode == 'w' && fd->ctr) {
	if(fd->ctr->slice)
	    fd->ctr->curr_slice++;
	if (-1 == cram_flush_container_mt(fd, fd->ctr))
	    return -1;
    }

    if (fd->pool) {
	t_pool_flush(fd->pool);

	if (0 != cram_flush_result(fd))
	    return -1;

	pthread_mutex_destroy(&fd->metrics_lock);
	pthread_mutex_destroy(&fd->ref_lock);
	pthread_mutex_destroy(&fd->bam_list_lock);

	fd->ctr = NULL; // prevent double freeing

	//fprintf(stderr, "CRAM: destroy queue %p\n", fd->rqueue);

	t_results_queue_destroy(fd->rqueue);
    }

    if (fd->mode == 'w') {
	/* Write EOF block */
	if (CRAM_MAJOR_VERS(fd->version) == 3) {
	    if (38 != hwrite(fd->fp,
			     "\x0f\x00\x00\x00\xff\xff\xff\xff" // Cont HDR
			     "\x0f\xe0\x45\x4f\x46\x00\x00\x00" // Cont HDR
			     "\x00\x01\x00"                     // Cont HDR
			     "\x05\xbd\xd9\x4f"                 // CRC32
			     "\x00\x01\x00\x06\x06"             // Comp.HDR blk
			     "\x01\x00\x01\x00\x01\x00"         // Comp.HDR blk
			     "\xee\x63\x01\x4b",                // CRC32
			     38))
		return -1;
	} else {
	    if (30 != hwrite(fd->fp,
			     "\x0b\x00\x00\x00\xff\xff\xff\xff"
			     "\x0f\xe0\x45\x4f\x46\x00\x00\x00"
			     "\x00\x01\x00\x00\x01\x00\x06\x06"
			     "\x01\x00\x01\x00\x01\x00", 30))
		return -1;
	}
    }

    for (bl = fd->bl; bl; bl = next) {
	int i, max_rec = fd->seqs_per_slice * fd->slices_per_container;

	next = bl->next;
	for (i = 0; i < max_rec; i++) {
	    if (bl->bams[i])
		bam_free(bl->bams[i]);
	}
	free(bl->bams);
	free(bl);
    }

    if (hclose(fd->fp) != 0)
	return -1;

    if (fd->file_def)
	cram_free_file_def(fd->file_def);

    if (fd->header)
	sam_hdr_free(fd->header);

    free(fd->prefix);

    if (fd->ctr)
	cram_free_container(fd->ctr);

    if (fd->refs)
	refs_free(fd->refs);
    if (fd->ref_free)
        free(fd->ref_free);

    for (i = 0; i < DS_END; i++)
	if (fd->m[i])
	    free(fd->m[i]);

    if (fd->index)
	cram_index_free(fd);

    if (fd->own_pool && fd->pool)
	t_pool_destroy(fd->pool, 0);

    free(fd);
    return 0;
}